

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_cli.c
# Opt level: O1

int ssl_parse_session_ticket_ext(mbedtls_ssl_context *ssl,uchar *buf,size_t len)

{
  mbedtls_ssl_config *pmVar1;
  mbedtls_ssl_session *session_00;
  int iVar2;
  mbedtls_ssl_handshake_params *extraout_RAX;
  long lVar3;
  mbedtls_ssl_handshake_params *pmVar4;
  mbedtls_ssl_session session;
  mbedtls_ssl_session local_b0;
  
  mbedtls_ssl_session_init(&local_b0);
  pmVar1 = ssl->conf;
  pmVar4 = (mbedtls_ssl_handshake_params *)pmVar1->f_ticket_parse;
  if ((((pmVar4 != (mbedtls_ssl_handshake_params *)0x0) &&
       (pmVar1->f_ticket_write !=
        (_func_int_void_ptr_mbedtls_ssl_session_ptr_uchar_ptr_uchar_ptr_size_t_ptr_uint32_t_ptr *)
        0x0)) && (ssl->handshake->new_session_ticket = 1, len != 0)) && (ssl->renego_status == 0)) {
    iVar2 = (*(code *)pmVar4)(pmVar1->p_ticket,&local_b0,buf,len);
    if (iVar2 == 0) {
      session_00 = ssl->session_negotiate;
      local_b0.id_len = session_00->id_len;
      memcpy(local_b0.id,session_00->id,local_b0.id_len);
      mbedtls_ssl_session_free(session_00);
      memcpy(ssl->session_negotiate,&local_b0,0x98);
      lVar3 = 0;
      do {
        local_b0.id[lVar3 + -0x18] = '\0';
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0x98);
      pmVar4 = ssl->handshake;
      pmVar4->resume = 1;
      pmVar4->new_session_ticket = 0;
    }
    else {
      mbedtls_ssl_session_free(&local_b0);
      pmVar4 = extraout_RAX;
    }
  }
  return (int)pmVar4;
}

Assistant:

static int ssl_parse_session_ticket_ext( mbedtls_ssl_context *ssl,
                                         const unsigned char *buf,
                                         size_t len )
{
    if( ssl->conf->session_tickets == MBEDTLS_SSL_SESSION_TICKETS_DISABLED ||
        len != 0 )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "non-matching session ticket extension" ) );
        mbedtls_ssl_send_alert_message( ssl, MBEDTLS_SSL_ALERT_LEVEL_FATAL,
                                        MBEDTLS_SSL_ALERT_MSG_HANDSHAKE_FAILURE );
        return( MBEDTLS_ERR_SSL_BAD_HS_SERVER_HELLO );
    }

    ((void) buf);

    ssl->handshake->new_session_ticket = 1;

    return( 0 );
}